

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void __thiscall ChatServer::incomingData(ChatServer *this,Stream *stream)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  long *plVar3;
  _Rb_tree_node_base *p_Var4;
  long *plVar5;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  Stream *local_28;
  
  local_28 = stream;
  readLine_abi_cxx11_(&local_88,stream);
  pmVar2 = std::
           map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->nicks,&local_28);
  pcVar1 = (pmVar2->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + pmVar2->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_68,(ulong)local_88._M_dataplus._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_38 = *plVar5;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar5;
    local_48 = (long *)*plVar3;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* Message from ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_88._M_dataplus._M_p,local_88._M_string_length);
  for (p_Var4 = *(_Rb_tree_node_base **)&this->field_0x60;
      p_Var4 != (_Rb_tree_node_base *)&this->field_0x50;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    plVar3 = *(long **)(p_Var4 + 1);
    (**(code **)(*plVar3 + 0x10))(plVar3,local_88._M_dataplus._M_p,local_88._M_string_length);
    (**(code **)(*plVar3 + 0x18))(plVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void incomingData(Stream* stream)
	{
		string line = readLine(stream);
		const string& nick = nicks[stream];
		line = nick + " : " + line;
		cout << "* Message from " << line;

		for (StreamsSet::iterator it = dataStreams.begin(); it != dataStreams.end(); ++it)
			sendString((*it), line);
	}